

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testDraw
          (FunctionalTest14_15 *this,GLuint routine_configuration,vec4<unsigned_int> *uni_input,
          vec4<unsigned_int> *expected_routine_1_result,
          vec4<unsigned_int> *expected_routine_2_result)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  uint *puVar5;
  long lVar6;
  bool bVar7;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  vec4<unsigned_int> routine_2_result;
  vec4<unsigned_int> routine_1_result;
  GLuint subroutine_indices [2];
  MessageBuilder message;
  vec4<unsigned_int> local_1e0;
  vec4<unsigned_int> local_1d0;
  vec4<unsigned_int> *local_1c0;
  GLuint local_1b8 [2];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  local_1c0 = expected_routine_2_result;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x15c0))
            (this->m_uniform_location,uni_input->m_x,uni_input->m_y,uni_input->m_z,uni_input->m_w);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e9a);
  lVar6 = 0;
  do {
    local_1b8[this->m_subroutine_uniform_locations[lVar6]] =
         this->m_subroutine_indices[lVar6][routine_configuration];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  (**(code **)(lVar4 + 0x1668))(0x8b31,2,local_1b8);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ea6);
  bVar7 = false;
  (**(code **)(lVar4 + 0x30))(0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eaa);
  (**(code **)(lVar4 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ead);
  (**(code **)(lVar4 + 0x638))();
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eb0);
  puVar5 = (uint *)(**(code **)(lVar4 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eb4);
  local_1d0.m_x = *puVar5;
  local_1d0.m_y = puVar5[1];
  local_1d0.m_z = puVar5[2];
  local_1d0.m_w = puVar5[3];
  local_1e0.m_x = puVar5[4];
  local_1e0.m_y = puVar5[5];
  local_1e0.m_z = puVar5[6];
  local_1e0.m_w = puVar5[7];
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ec5);
  if (local_1d0.m_x == expected_routine_1_result->m_x) {
    if ((((local_1d0.m_y == expected_routine_1_result->m_y) &&
         (local_1d0.m_z == expected_routine_1_result->m_z)) &&
        (local_1d0.m_w == expected_routine_1_result->m_w)) &&
       (((local_1e0.m_x == local_1c0->m_x && (local_1e0.m_y == local_1c0->m_y)) &&
        (local_1e0.m_z == local_1c0->m_z)))) {
      bVar7 = local_1e0.m_w == local_1c0->m_w;
    }
    else {
      bVar7 = false;
    }
  }
  if (bVar7 == false) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Error. Invalid result.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Routine_1, result: ",0x13)
    ;
    Utils::vec4<unsigned_int>::log(&local_1d0,__x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    Utils::vec4<unsigned_int>::log(expected_routine_1_result,__x_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Routine_2, result: ",0x13)
    ;
    Utils::vec4<unsigned_int>::log(&local_1e0,__x_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    Utils::vec4<unsigned_int>::log(local_1c0,__x_02);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  return bVar7;
}

Assistant:

bool FunctionalTest14_15::testDraw(glw::GLuint routine_configuration, const Utils::vec4<glw::GLuint>& uni_input,
								   const Utils::vec4<glw::GLuint>& expected_routine_1_result,
								   const Utils::vec4<glw::GLuint>& expected_routine_2_result) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;
	GLuint				  subroutine_indices[2];
	static const GLuint   n_subroutine_uniforms = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	/* Set up input data uniforms */
	gl.uniform4ui(m_uniform_location, uni_input.m_x, uni_input.m_y, uni_input.m_z, uni_input.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Prepare subroutine uniform data */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];

		subroutine_indices[location] = m_subroutine_indices[i][routine_configuration];
	}

	/* Set up subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_subroutine_uniforms, &subroutine_indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLuint* feedback_data = (GLuint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLuint> routine_1_result;
	Utils::vec4<GLuint> routine_2_result;

	routine_1_result.m_x = feedback_data[0 + 0];
	routine_1_result.m_y = feedback_data[0 + 1];
	routine_1_result.m_z = feedback_data[0 + 2];
	routine_1_result.m_w = feedback_data[0 + 3];

	routine_2_result.m_x = feedback_data[4 + 0];
	routine_2_result.m_y = feedback_data[4 + 1];
	routine_2_result.m_z = feedback_data[4 + 2];
	routine_2_result.m_w = feedback_data[4 + 3];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Verifiy */
	result = result && (routine_1_result == expected_routine_1_result);
	result = result && (routine_2_result == expected_routine_2_result);

	/* Log error if any */
	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Routine_1, result: ";

		routine_1_result.log(message);

		message << ", expected: ";

		expected_routine_1_result.log(message);

		message << "Routine_2, result: ";

		routine_2_result.log(message);

		message << ", expected: ";

		expected_routine_2_result.log(message);

		message << tcu::TestLog::EndMessage;
	}

	/* Done */
	return result;
}